

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereClauseClear(WhereClause *pWC)

{
  sqlite3 *db_00;
  sqlite3 *db;
  WhereTerm *a;
  int i;
  WhereClause *pWC_local;
  
  db_00 = pWC->pWInfo->pParse->db;
  a._4_4_ = pWC->nTerm;
  db = (sqlite3 *)pWC->a;
  while (a._4_4_ = a._4_4_ + -1, -1 < a._4_4_) {
    if (((ulong)db->pDfltColl & 0x10000) != 0) {
      sqlite3ExprDelete(db_00,(Expr *)db->pVfs);
    }
    if (((ulong)db->pDfltColl & 0x100000) == 0) {
      if (((ulong)db->pDfltColl & 0x200000) != 0) {
        whereAndInfoDelete(db_00,*(WhereAndInfo **)&db->nDb);
      }
    }
    else {
      whereOrInfoDelete(db_00,*(WhereOrInfo **)&db->nDb);
    }
    db = (sqlite3 *)&db->openFlags;
  }
  if (pWC->a != pWC->aStatic) {
    sqlite3DbFree(db_00,pWC->a);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereClauseClear(WhereClause *pWC){
  int i;
  WhereTerm *a;
  sqlite3 *db = pWC->pWInfo->pParse->db;
  for(i=pWC->nTerm-1, a=pWC->a; i>=0; i--, a++){
    if( a->wtFlags & TERM_DYNAMIC ){
      sqlite3ExprDelete(db, a->pExpr);
    }
    if( a->wtFlags & TERM_ORINFO ){
      whereOrInfoDelete(db, a->u.pOrInfo);
    }else if( a->wtFlags & TERM_ANDINFO ){
      whereAndInfoDelete(db, a->u.pAndInfo);
    }
  }
  if( pWC->a!=pWC->aStatic ){
    sqlite3DbFree(db, pWC->a);
  }
}